

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

_Bool arm_cpu_exec_interrupt_arm(CPUState *cs,int interrupt_request)

{
  CPUClass *pCVar1;
  CPUARMState *env_00;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t cur_el_00;
  uint64_t hcr_el2_00;
  int32_t local_48;
  uint32_t local_44;
  uint32_t excp_idx;
  uint32_t target_el;
  uint64_t hcr_el2;
  _Bool secure;
  uint32_t cur_el;
  CPUARMState *env;
  CPUClass *cc;
  int interrupt_request_local;
  CPUState *cs_local;
  
  pCVar1 = cs->cc;
  env_00 = (CPUARMState *)cs->env_ptr;
  cur_el_00 = arm_current_el(env_00);
  _Var2 = arm_is_secure(env_00);
  hcr_el2_00 = arm_hcr_el2_eff_arm(env_00);
  if ((interrupt_request & 0x10U) == 0) {
LAB_005e353c:
    if ((interrupt_request & 2U) != 0) {
      local_48 = 5;
      local_44 = arm_phys_excp_target_el_arm(cs,5,cur_el_00,_Var2);
      _Var3 = arm_excp_unmasked(cs,5,local_44,cur_el_00,_Var2,hcr_el2_00);
      if (_Var3) goto LAB_005e3620;
    }
    if ((interrupt_request & 0x40U) != 0) {
      local_48 = 0xe;
      local_44 = 1;
      _Var3 = arm_excp_unmasked(cs,0xe,1,cur_el_00,_Var2,hcr_el2_00);
      if (_Var3) goto LAB_005e3620;
    }
    if ((interrupt_request & 0x200U) != 0) {
      local_48 = 0xf;
      local_44 = 1;
      _Var2 = arm_excp_unmasked(cs,0xf,1,cur_el_00,_Var2,hcr_el2_00);
      if (_Var2) goto LAB_005e3620;
    }
    cs_local._7_1_ = false;
  }
  else {
    local_48 = 6;
    local_44 = arm_phys_excp_target_el_arm(cs,6,cur_el_00,_Var2);
    _Var3 = arm_excp_unmasked(cs,6,local_44,cur_el_00,_Var2,hcr_el2_00);
    if (!_Var3) goto LAB_005e353c;
LAB_005e3620:
    cs->exception_index = local_48;
    (env_00->exception).target_el = local_44;
    (*pCVar1->do_interrupt)((CPUState_conflict *)cs);
    cs_local._7_1_ = true;
  }
  return cs_local._7_1_;
}

Assistant:

bool arm_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    CPUClass *cc = CPU_GET_CLASS(cs);
    CPUARMState *env = cs->env_ptr;
    uint32_t cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);
    uint32_t target_el;
    uint32_t excp_idx;

    /* The prioritization of interrupts is IMPLEMENTATION DEFINED. */

    if (interrupt_request & CPU_INTERRUPT_FIQ) {
        excp_idx = EXCP_FIQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        excp_idx = EXCP_IRQ;
        target_el = arm_phys_excp_target_el(cs, excp_idx, cur_el, secure);
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VIRQ) {
        excp_idx = EXCP_VIRQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    if (interrupt_request & CPU_INTERRUPT_VFIQ) {
        excp_idx = EXCP_VFIQ;
        target_el = 1;
        if (arm_excp_unmasked(cs, excp_idx, target_el,
                              cur_el, secure, hcr_el2)) {
            goto found;
        }
    }
    return false;

 found:
    cs->exception_index = excp_idx;
    env->exception.target_el = target_el;
    cc->do_interrupt(cs);
    return true;
}